

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

unique_ptr<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>
__thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::createExecutionQueue
          (BuildSystemFrontendDelegate *this)

{
  long lVar1;
  QualityOfService qos;
  QualityOfService *pQVar2;
  ExecutionQueue *pEVar3;
  long *in_RSI;
  Twine TStack_118;
  undefined8 local_100;
  undefined4 local_f8;
  BuildSystemInvocation invocation;
  
  lVar1 = in_RSI[6];
  BuildSystemInvocation::BuildSystemInvocation
            (&invocation,*(BuildSystemInvocation **)(*(long *)(lVar1 + 0x30) + 0x10));
  if (invocation.qos.Storage.hasVal == true) {
    pQVar2 = llvm::Optional<llbuild::basic::QualityOfService>::getPointer(&invocation.qos);
    qos = *pQVar2;
  }
  else {
    qos = llbuild::basic::getDefaultQualityOfService();
  }
  if (invocation.useSerialBuild == false) {
    if (invocation.schedulerLanes != 0) goto LAB_0018a283;
    invocation.schedulerLanes = std::thread::hardware_concurrency();
    if (invocation.schedulerLanes != 0) goto LAB_0018a283;
    local_100 = 0;
    local_f8 = 0;
    llvm::Twine::Twine(&TStack_118,"unable to detect number of CPUs");
    (**(code **)(*in_RSI + 0x18))();
  }
  invocation.schedulerLanes = 1;
LAB_0018a283:
  pEVar3 = llbuild::basic::createLaneBasedExecutionQueue
                     ((ExecutionQueueDelegate *)(lVar1 + 0x20),invocation.schedulerLanes,
                      invocation.schedulerAlgorithm,qos,invocation.environment);
  (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate = (_func_int **)pEVar3;
  BuildSystemInvocation::~BuildSystemInvocation(&invocation);
  return (__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExecutionQueue>
BuildSystemFrontendDelegate::createExecutionQueue() {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  auto invocation = impl->frontend->invocation;
  QualityOfService qos = invocation.qos.hasValue() ?
      invocation.qos.getValue() : getDefaultQualityOfService();
  
  if (invocation.useSerialBuild) {
    return std::unique_ptr<ExecutionQueue>(
        createLaneBasedExecutionQueue(impl->executionQueueDelegate, 1,
                                      invocation.schedulerAlgorithm, qos,
                                      invocation.environment));
  }
    
  // Get the number of CPUs to use.
  unsigned numLanes = invocation.schedulerLanes;
  if (numLanes == 0) {
    unsigned numCPUs = std::thread::hardware_concurrency();
    if (numCPUs == 0) {
      error("<unknown>", {}, "unable to detect number of CPUs");
      numLanes = 1;
    } else {
      numLanes = numCPUs;
    }
  }
    
  return std::unique_ptr<ExecutionQueue>(
      createLaneBasedExecutionQueue(impl->executionQueueDelegate, numLanes,
                                    invocation.schedulerAlgorithm, qos,
                                    invocation.environment));
}